

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O1

void __thiscall
burst::
subset_iterator<std::_Rb_tree_const_iterator<int>,_std::greater<void>,_std::vector<std::_Rb_tree_const_iterator<int>,_std::allocator<std::_Rb_tree_const_iterator<int>_>_>_>
::subset_iterator(subset_iterator<std::_Rb_tree_const_iterator<int>,_std::greater<void>,_std::vector<std::_Rb_tree_const_iterator<int>,_std::allocator<std::_Rb_tree_const_iterator<int>_>_>_>
                  *this,_Rb_tree_node_base *first,_Rb_tree_node_base *last)

{
  _Base_ptr p_Var1;
  pointer p_Var2;
  _Rb_tree_const_iterator<int> _Var3;
  __normal_iterator<std::_Rb_tree_const_iterator<int>_*,_std::vector<std::_Rb_tree_const_iterator<int>,_std::allocator<std::_Rb_tree_const_iterator<int>_>_>_>
  _Var4;
  size_type __n;
  allocator_type local_21;
  
  (this->m_begin)._M_node = first;
  (this->m_end)._M_node = last;
  if (first == last) {
    __n = 0;
  }
  else {
    __n = 0;
    do {
      first = (_Rb_tree_node_base *)std::_Rb_tree_increment(first);
      __n = __n + 1;
    } while (first != last);
  }
  std::
  vector<std::_Rb_tree_const_iterator<int>,_std::allocator<std::_Rb_tree_const_iterator<int>_>_>::
  vector(&this->m_subset,__n,&local_21);
  this->m_subset_size = 0;
  p_Var1 = (this->m_end)._M_node;
  _Var3 = std::
          __is_sorted_until<std::_Rb_tree_const_iterator<int>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                    ((this->m_begin)._M_node,p_Var1);
  if (_Var3._M_node != p_Var1) {
    __assert_fail("std::is_sorted(m_begin, m_end, m_compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                  ,0x5d,
                  "burst::subset_iterator<std::_Rb_tree_const_iterator<int>, std::greater<void>>::subset_iterator(ForwardIterator, ForwardIterator, compare_type) [ForwardIterator = std::_Rb_tree_const_iterator<int>, Compare = std::greater<void>, SubsetContainer = std::vector<std::_Rb_tree_const_iterator<int>>]"
                 );
  }
  p_Var2 = (this->m_subset).
           super__Vector_base<std::_Rb_tree_const_iterator<int>,_std::allocator<std::_Rb_tree_const_iterator<int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var4 = next_subset<__gnu_cxx::__normal_iterator<std::_Rb_tree_const_iterator<int>*,std::vector<std::_Rb_tree_const_iterator<int>,std::allocator<std::_Rb_tree_const_iterator<int>>>>,std::_Rb_tree_const_iterator<int>,std::greater<void>>
                    (p_Var2,p_Var2 + this->m_subset_size,(this->m_begin)._M_node,
                     (this->m_end)._M_node);
  this->m_subset_size =
       (long)_Var4._M_current -
       (long)(this->m_subset).
             super__Vector_base<std::_Rb_tree_const_iterator<int>,_std::allocator<std::_Rb_tree_const_iterator<int>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  return;
}

Assistant:

explicit subset_iterator
            (
                ForwardIterator first, ForwardIterator last,
                compare_type compare = compare_type{}
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subset(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subset_size(0),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_begin, m_end, m_compare));
            increment();
        }